

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O2

void Cmf_CreateOptions_rec(Vec_Wec_t *vPars,int iPar,char (*Argv) [20],int Argc,Vec_Ptr_t *vOpts)

{
  anon_union_4_2_947302e2 v;
  uint uVar1;
  float fVar2;
  int iVar3;
  Vec_Int_t *p;
  ulong uVar4;
  satoko_opts_t *Entry;
  char *Entry_00;
  ulong uVar5;
  int argc;
  ulong uVar6;
  int i;
  char (*__s) [20];
  long lVar7;
  int local_388;
  char *local_358 [101];
  
  uVar6 = (ulong)Argc;
  lVar7 = uVar6 << 0x20;
  __s = Argv + uVar6;
  local_388 = iPar;
  while( true ) {
    if (100 < (long)uVar6) {
      __assert_fail("Argc <= CMD_AUTO_ARG_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                    ,0x1cc,
                    "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
    }
    argc = (int)uVar6;
    if (local_388 == vPars->nSize) {
      uVar4 = 0;
      uVar5 = 0;
      if (0 < argc) {
        uVar5 = uVar6 & 0xffffffff;
      }
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        local_358[uVar4] = *Argv;
        Argv = Argv + 1;
      }
      Entry = Cmd_DeriveOptionFromSettings(argc,local_358);
      if (Entry == (satoko_opts_t *)0x0) {
        puts("Cannot parse command line options...");
      }
      else {
        Vec_PtrPush(vOpts,Entry);
        Entry_00 = Cmd_DeriveConvertIntoString(argc,local_358);
        Vec_PtrPush(vOpts,Entry_00);
        if ((long)vOpts->nSize < 1) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
        }
        printf("Adding settings %s\n",vOpts->pArray[(long)vOpts->nSize + -1]);
      }
      return;
    }
    p = Vec_WecEntry(vPars,local_388);
    iVar3 = p->nSize;
    if (iVar3 != 2) {
      i = 1;
      while( true ) {
        if (iVar3 <= i) {
          return;
        }
        uVar1 = Vec_IntEntry(p,i + -1);
        fVar2 = (float)Vec_IntEntry(p,i);
        if (fVar2 < 0.0) break;
        sprintf(Argv[lVar7 >> 0x20],"-%c",(ulong)uVar1);
        if ((fVar2 != (float)(int)fVar2) || (NAN(fVar2) || NAN((float)(int)fVar2))) {
          sprintf(Argv[(lVar7 >> 0x20) + 1],"%.3f",(double)fVar2);
        }
        else {
          sprintf(Argv[(lVar7 >> 0x20) + 1],"%d",(ulong)(uint)(int)fVar2);
        }
        Cmf_CreateOptions_rec(vPars,local_388 + 1,Argv,argc + 2,vOpts);
        iVar3 = p->nSize;
        i = i + 2;
      }
      __assert_fail("NumF >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                    ,0x1f1,
                    "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
    }
    uVar1 = Vec_IntEntry(p,0);
    fVar2 = (float)Vec_IntEntry(p,1);
    if ((fVar2 != -1.0) || (NAN(fVar2))) break;
    local_388 = local_388 + 1;
    Cmf_CreateOptions_rec(vPars,local_388,Argv,argc,vOpts);
    sprintf(*__s,"-%c",(ulong)uVar1);
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x100000000;
    __s = __s + 1;
  }
  __assert_fail("Abc_Int2Float(Num) == -1.0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdAuto.c"
                ,0x1e4,
                "void Cmf_CreateOptions_rec(Vec_Wec_t *, int, char (*)[20], int, Vec_Ptr_t *)");
}

Assistant:

void Cmf_CreateOptions_rec( Vec_Wec_t * vPars, int iPar, char Argv[CMD_AUTO_ARG_MAX][20], int Argc, Vec_Ptr_t * vOpts )
{
    Vec_Int_t * vLine;
    int Symb, Num, i;
    assert( Argc <= CMD_AUTO_ARG_MAX );
    if ( Vec_WecSize(vPars) == iPar )
    {
        satoko_opts_t * pOpts;
        char * pArgv[CMD_AUTO_ARG_MAX];
        for ( i = 0; i < Argc; i++ )
            pArgv[i] = Argv[i];
        pOpts = Cmd_DeriveOptionFromSettings( Argc, pArgv );
        if ( pOpts == NULL )
            printf( "Cannot parse command line options...\n" );
        else
        {
            Vec_PtrPush( vOpts, pOpts );
            Vec_PtrPush( vOpts, Cmd_DeriveConvertIntoString(Argc, pArgv) );
            printf( "Adding settings %s\n", (char *)Vec_PtrEntryLast(vOpts) );
        }
        return;
    }
    vLine = Vec_WecEntry( vPars, iPar );
    // consider binary option
    if ( Vec_IntSize(vLine) == 2 )
    {
        Symb = Vec_IntEntry( vLine, 0 );
        Num = Vec_IntEntry( vLine, 1 );
        assert( Abc_Int2Float(Num) == -1.0 );
        // create one setting without this option
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc, vOpts );
        // create another setting with this option
        sprintf( Argv[Argc], "-%c", Symb );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+1, vOpts );
        return;
    }
    // consider numeric option
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        // create setting with this option
        assert( NumF >= 0 );
        sprintf( Argv[Argc], "-%c", Symb );
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc+1], "%d", (int)NumF );
        else
            sprintf( Argv[Argc+1], "%.3f", NumF );
        Cmf_CreateOptions_rec( vPars, iPar+1, Argv, Argc+2, vOpts );
    }
}